

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-curse.c
# Opt level: O0

void get_curse_display(menu_conflict1 *menu,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,
                      wchar_t width)

{
  void *pvVar1;
  char *name;
  char local_88 [4];
  wchar_t power;
  char buf [80];
  wchar_t attr;
  curse_menu_data *choice;
  wchar_t width_local;
  wchar_t col_local;
  wchar_t row_local;
  _Bool cursor_local;
  wchar_t oid_local;
  menu_conflict1 *menu_local;
  
  pvVar1 = menu_priv((menu_conflict *)menu);
  buf[0x4c] = '\x01';
  buf[0x4d] = '\0';
  buf[0x4e] = '\0';
  buf[0x4f] = '\0';
  if (cursor) {
    buf[0x4c] = '\x0e';
    buf[0x4d] = '\0';
    buf[0x4e] = '\0';
    buf[0x4f] = '\0';
  }
  strnfmt(local_88,0x50,"  %s (curse strength %d)",
          curses[*(int *)((long)pvVar1 + (long)oid * 8)].name,
          (ulong)*(uint *)((long)pvVar1 + (long)oid * 8 + 4));
  c_put_str((uint8_t)buf._76_4_,local_88,row,col);
  return;
}

Assistant:

static void get_curse_display(struct menu *menu, int oid, bool cursor, int row,
					  int col, int width)
{
	struct curse_menu_data *choice = menu_priv(menu);
	int attr = cursor ? COLOUR_L_BLUE : COLOUR_WHITE;
	char buf[80];
	int power = choice[oid].power;
	char *name = curses[choice[oid].index].name;

	strnfmt(buf, sizeof(buf), "  %s (curse strength %d)", name, power);
	c_put_str(attr, buf, row, col);
}